

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QFileInfo>::reallocateAndGrow
          (QArrayDataPointer<QFileInfo> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QFileInfo> *old)

{
  QFileInfo *pQVar1;
  Data *pDVar2;
  QFileInfo *pQVar3;
  undefined1 *puVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  QFileInfo *fileinfo;
  long in_FS_OFFSET;
  QArrayDataPointer<QFileInfo> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QFileInfo> *)0x0 && where == GrowsAtEnd) {
    pDVar2 = this->d;
    if (pDVar2 == (Data *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = 1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar5)) {
      if (pDVar2 == (Data *)0x0) {
        lVar6 = 0;
        lVar7 = 0;
      }
      else {
        lVar6 = (pDVar2->super_QArrayData).alloc;
        lVar7 = (this->size - (pDVar2->super_QArrayData).alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
                >> 3);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        QtPrivate::QMovableArrayOps<QFileInfo>::reallocate
                  ((QMovableArrayOps<QFileInfo> *)this,lVar6 + n + lVar7,Grow);
        return;
      }
      goto LAB_0022e0ec;
    }
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QFileInfo *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_48,this,n,where);
  pQVar3 = local_48.ptr;
  if ((n < 1) || (local_48.ptr != (QFileInfo *)0x0)) {
    if (this->size != 0) {
      lVar6 = this->size + (n >> 0x3f & n);
      if (this->d == (Data *)0x0) {
        bVar5 = true;
      }
      else {
        bVar5 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      }
      fileinfo = this->ptr;
      pQVar1 = fileinfo + lVar6;
      if ((old != (QArrayDataPointer<QFileInfo> *)0x0) || (bVar5)) {
        if ((lVar6 != 0) && (0 < lVar6)) {
          do {
            QFileInfo::QFileInfo(pQVar3 + local_48.size,fileinfo);
            fileinfo = fileinfo + 1;
            local_48.size = local_48.size + 1;
          } while (fileinfo < pQVar1);
        }
      }
      else if ((lVar6 != 0) && (0 < lVar6)) {
        do {
          QFileInfo::QFileInfo(pQVar3 + local_48.size,fileinfo);
          fileinfo = fileinfo + 1;
          local_48.size = local_48.size + 1;
        } while (fileinfo < pQVar1);
      }
    }
    pDVar2 = this->d;
    pQVar3 = this->ptr;
    this->d = local_48.d;
    this->ptr = local_48.ptr;
    puVar4 = (undefined1 *)this->size;
    this->size = local_48.size;
    local_48.d = pDVar2;
    local_48.ptr = pQVar3;
    local_48.size = (qsizetype)puVar4;
    if (old != (QArrayDataPointer<QFileInfo> *)0x0) {
      local_48.d = old->d;
      local_48.ptr = old->ptr;
      old->d = pDVar2;
      old->ptr = pQVar3;
      local_48.size = old->size;
      old->size = (qsizetype)puVar4;
    }
    ~QArrayDataPointer(&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    qBadAlloc();
  }
LAB_0022e0ec:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }